

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTime.cxx
# Opt level: O1

bool __thiscall cmFileTime::Load(cmFileTime *this,string *fileName)

{
  int iVar1;
  stat fst;
  stat sStack_98;
  
  iVar1 = stat((fileName->_M_dataplus)._M_p,&sStack_98);
  if (iVar1 == 0) {
    this->Time = sStack_98.st_mtim.tv_sec * 1000000000 + sStack_98.st_mtim.tv_nsec;
  }
  return iVar1 == 0;
}

Assistant:

bool cmFileTime::Load(std::string const& fileName)
{
#if !defined(_WIN32) || defined(__CYGWIN__)
  // POSIX version.  Use the stat function.
  struct stat fst;
  if (::stat(fileName.c_str(), &fst) != 0) {
    return false;
  }
#  if CMake_STAT_HAS_ST_MTIM
  // Nanosecond resolution
  this->Time = fst.st_mtim.tv_sec * UtPerS + fst.st_mtim.tv_nsec;
#  elif CMake_STAT_HAS_ST_MTIMESPEC
  // Nanosecond resolution
  this->Time = fst.st_mtimespec.tv_sec * UtPerS + fst.st_mtimespec.tv_nsec;
#  else
  // Second resolution
  this->Time = fst.st_mtime * UtPerS;
#  endif
#else
  // Windows version.  Get the modification time from extended file attributes.
  WIN32_FILE_ATTRIBUTE_DATA fdata;
  if (!GetFileAttributesExW(cmsys::Encoding::ToWide(fileName).c_str(),
                            GetFileExInfoStandard, &fdata)) {
    return false;
  }

  // Copy the file time to the output location.
  using uint64 = unsigned long long;

  this->Time = static_cast<TimeType>(
    (uint64(fdata.ftLastWriteTime.dwHighDateTime) << 32) +
    fdata.ftLastWriteTime.dwLowDateTime);
#endif
  return true;
}